

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arcflowsol.cpp
# Opt level: O1

vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
* __thiscall
ArcflowSol::remove_excess
          (vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
           *__return_storage_ptr__,ArcflowSol *this,
          vector<std::pair<int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<int,_std::vector<int,_std::allocator<int>_>_>_>_>
          *sol,vector<int,_std::allocator<int>_> *_dem)

{
  _Rb_tree_header *p_Var1;
  pointer piVar2;
  pointer pIVar3;
  pointer ppVar4;
  pointer ppVar5;
  long lVar6;
  iterator __position;
  pointer ppVar7;
  pointer ppVar8;
  vector<std::pair<int,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,std::allocator<std::pair<int,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>>
  *this_00;
  pointer ppVar9;
  int iVar10;
  int iVar11;
  pointer ppVar12;
  mapped_type *pmVar13;
  _Rb_tree_node_base *p_Var14;
  _Base_ptr p_Var15;
  ulong uVar16;
  int iVar17;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *__k;
  int *it;
  pointer piVar18;
  int *piVar19;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_int>_>,_std::_Rb_tree_iterator<std::pair<const_int,_int>_>_>
  pVar20;
  vector<int,_std::allocator<int>_> rm;
  vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
  *finalsol;
  map<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_int,_std::less<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<const_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_int>_>_>
  mp;
  vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
  tmp;
  allocator_type local_109;
  int *local_108;
  int *piStack_100;
  int *local_f8;
  vector<int,_std::allocator<int>_> *local_e8;
  vector<std::pair<int,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,std::allocator<std::pair<int,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>>
  *local_e0;
  pointer local_d8;
  _Rb_tree_iterator<std::pair<const_int,_int>_> local_d0;
  pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_> local_c8;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  local_a8;
  pointer local_78;
  pointer ppStack_70;
  pointer ppStack_68;
  vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
  local_58;
  pointer local_38;
  
  local_58.
  super__Vector_base<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Vector_base<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ppVar12 = (sol->
            super__Vector_base<std::pair<int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<int,_std::vector<int,_std::allocator<int>_>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_38 = (sol->
             super__Vector_base<std::pair<int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<int,_std::vector<int,_std::allocator<int>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  local_e0 = (vector<std::pair<int,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,std::allocator<std::pair<int,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>>
              *)__return_storage_ptr__;
  if (ppVar12 != local_38) {
    p_Var1 = &local_a8._M_impl.super__Rb_tree_header;
    local_e8 = _dem;
    do {
      local_a8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_a8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_a8._M_impl.super__Rb_tree_header._M_node_count = 0;
      piVar2 = (ppVar12->second).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      piVar18 = (ppVar12->second).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      local_d8 = ppVar12;
      local_a8._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
      local_a8._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
      for (; piVar18 != piVar2; piVar18 = piVar18 + 1) {
        pmVar13 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                  operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                              *)&local_a8,piVar18);
        *pmVar13 = *pmVar13 + 1;
      }
      local_108 = (int *)0x0;
      piStack_100 = (int *)0x0;
      local_f8 = (int *)0x0;
      for (iVar11 = local_d8->first; 0 < iVar11; iVar11 = iVar11 - iVar17) {
        piVar19 = local_108;
        __position._M_current = piStack_100;
        ppVar4 = local_78;
        ppVar5 = ppStack_70;
        ppVar7 = ppStack_68;
        p_Var14 = local_a8._M_impl.super__Rb_tree_header._M_header._M_left;
        if (piStack_100 != local_108) {
          __position._M_current = local_108;
        }
        for (; local_108 = piVar19, piStack_100 = __position._M_current, local_78 = ppVar4,
            ppStack_70 = ppVar5, ppStack_68 = ppVar7, (_Rb_tree_header *)p_Var14 != p_Var1;
            p_Var14 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var14)) {
          iVar17 = (_dem->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start
                   [(this->inst).items.super__Vector_base<Item,_std::allocator<Item>_>._M_impl.
                    super__Vector_impl_data._M_start[(int)p_Var14[1]._M_color].type];
          iVar10 = *(int *)&p_Var14[1].field_0x4;
          if (iVar17 < *(int *)&p_Var14[1].field_0x4) {
            iVar10 = iVar17;
          }
          *(int *)&p_Var14[1].field_0x4 = iVar10;
          if (iVar10 == 0) {
            if (__position._M_current == local_f8) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)&local_108,__position,
                         (int *)(p_Var14 + 1));
            }
            else {
              *__position._M_current = p_Var14[1]._M_color;
              piStack_100 = __position._M_current + 1;
            }
          }
          piVar19 = local_108;
          __position._M_current = piStack_100;
          ppVar4 = local_78;
          ppVar5 = ppStack_70;
          ppVar7 = ppStack_68;
        }
        for (; piVar19 != __position._M_current; piVar19 = piVar19 + 1) {
          pVar20 = std::
                   _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                   ::equal_range(&local_a8,piVar19);
          std::
          _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
          ::_M_erase_aux(&local_a8,(_Base_ptr)pVar20.first._M_node,(_Base_ptr)pVar20.second._M_node)
          ;
        }
        local_d0._M_node = local_a8._M_impl.super__Rb_tree_header._M_header._M_left;
        iVar17 = iVar11;
        if ((_Rb_tree_header *)local_a8._M_impl.super__Rb_tree_header._M_header._M_left != p_Var1) {
          pIVar3 = (this->inst).items.super__Vector_base<Item,_std::allocator<Item>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar18 = (local_e8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          p_Var15 = local_a8._M_impl.super__Rb_tree_header._M_header._M_left;
          do {
            iVar10 = piVar18[pIVar3[(int)p_Var15[1]._M_color].type] / *(int *)&p_Var15[1].field_0x4;
            if (iVar10 < iVar17) {
              iVar17 = iVar10;
            }
            p_Var15 = (_Base_ptr)std::_Rb_tree_increment(p_Var15);
          } while ((_Rb_tree_header *)p_Var15 != p_Var1);
        }
        std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
        vector<std::_Rb_tree_iterator<std::pair<int_const,int>>,void>
                  ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&local_78,
                   local_d0,(_Rb_tree_iterator<std::pair<const_int,_int>_>)p_Var1,&local_109);
        local_c8.second.
        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
        super__Vector_impl_data._M_start = local_78;
        local_c8.second.
        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
        super__Vector_impl_data._M_finish = ppStack_70;
        local_c8.second.
        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = ppStack_68;
        local_78 = (pointer)0x0;
        ppStack_70 = (pointer)0x0;
        ppStack_68 = (pointer)0x0;
        local_c8.first = iVar17;
        std::
        vector<std::pair<int,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,std::allocator<std::pair<int,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>>
        ::
        emplace_back<std::pair<int,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
                  ((vector<std::pair<int,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,std::allocator<std::pair<int,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>>
                    *)&local_58,&local_c8);
        if (local_c8.second.
            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_c8.second.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_78 != (pointer)0x0) {
          operator_delete(local_78);
        }
        if ((_Rb_tree_header *)local_a8._M_impl.super__Rb_tree_header._M_header._M_left != p_Var1) {
          pIVar3 = (this->inst).items.super__Vector_base<Item,_std::allocator<Item>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar18 = (local_e8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          p_Var15 = local_a8._M_impl.super__Rb_tree_header._M_header._M_left;
          do {
            piVar19 = piVar18 + pIVar3[(int)p_Var15[1]._M_color].type;
            *piVar19 = *piVar19 - *(int *)&p_Var15[1].field_0x4 * iVar17;
            p_Var15 = (_Base_ptr)std::_Rb_tree_increment(p_Var15);
          } while ((_Rb_tree_header *)p_Var15 != p_Var1);
        }
        _dem = local_e8;
      }
      if (local_108 != (int *)0x0) {
        operator_delete(local_108);
      }
      std::
      _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
      ::~_Rb_tree(&local_a8);
      ppVar12 = local_d8 + 1;
    } while (ppVar12 != local_38);
  }
  ppVar9 = local_58.
           super__Vector_base<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  p_Var1 = &local_a8._M_impl.super__Rb_tree_header;
  local_a8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_a8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_a8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_a8._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_a8._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  if (local_58.
      super__Vector_base<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_58.
      super__Vector_base<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    ppVar8 = local_58.
             super__Vector_base<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      __k = &ppVar8->second;
      ppVar4 = (__k->super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)
               ._M_impl.super__Vector_impl_data._M_start;
      ppVar5 = (__k->super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)
               ._M_impl.super__Vector_impl_data._M_finish;
      if (ppVar4 != ppVar5) {
        uVar16 = (long)ppVar5 - (long)ppVar4 >> 3;
        lVar6 = 0x3f;
        if (uVar16 != 0) {
          for (; uVar16 >> lVar6 == 0; lVar6 = lVar6 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                  (ppVar4,ppVar5,((uint)lVar6 ^ 0x3f) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  (ppVar4,ppVar5);
      }
      iVar11 = *(int *)((long)(__k + -1) + 0x10);
      pmVar13 = std::
                map<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_int,_std::less<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<const_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_int>_>_>
                ::operator[]((map<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_int,_std::less<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<const_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_int>_>_>
                              *)&local_a8,__k);
      *pmVar13 = *pmVar13 + iVar11;
      ppVar8 = (pointer)(__k + 1);
    } while ((pointer)(__k + 1) != ppVar9);
  }
  this_00 = local_e0;
  *(undefined8 *)local_e0 = 0;
  *(undefined8 *)(local_e0 + 8) = 0;
  *(undefined8 *)(local_e0 + 0x10) = 0;
  if ((_Rb_tree_header *)local_a8._M_impl.super__Rb_tree_header._M_header._M_left != p_Var1) {
    p_Var15 = local_a8._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      local_c8.first = *(int *)&p_Var15[1]._M_right;
      std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
                (&local_c8.second,
                 (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)(p_Var15 + 1)
                );
      std::
      vector<std::pair<int,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,std::allocator<std::pair<int,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>>
      ::
      emplace_back<std::pair<int,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
                (this_00,&local_c8);
      if (local_c8.second.
          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_c8.second.
                        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      p_Var15 = (_Base_ptr)std::_Rb_tree_increment(p_Var15);
    } while ((_Rb_tree_header *)p_Var15 != p_Var1);
  }
  std::
  _Rb_tree<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::pair<const_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_int>,_std::_Select1st<std::pair<const_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_int>_>,_std::less<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<const_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_int>_>_>
  ::~_Rb_tree((_Rb_tree<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::pair<const_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_int>,_std::_Select1st<std::pair<const_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_int>_>,_std::less<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<const_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_int>_>_>
               *)&local_a8);
  std::
  vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
  ::~vector(&local_58);
  return (vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
          *)this_00;
}

Assistant:

std::vector<pattern_pair> ArcflowSol::remove_excess(const std::vector<pattern_int> &sol,
													std::vector<int> *_dem) const {
	std::vector<int> &dem = *_dem;
	std::vector<pattern_pair> tmp;
	for (const pattern_int &pat : sol) {
		std::map<int, int> count;
		for (const int &it : pat.second) {
			count[it] += 1;
		}
		std::vector<int> rm;
		int rep = pat.first;
		while (rep > 0) {
			rm.clear();
			for (auto &kvpair : count) {
				int type = inst.items[kvpair.first].type;
				kvpair.second = std::min(kvpair.second, dem[type]);
				if (kvpair.second == 0) {
					rm.push_back(kvpair.first);
				}
			}
			for (const int &ind : rm) {
				count.erase(ind);
			}

			int f = rep;
			for (const auto &kvpair : count) {
				int type = inst.items[kvpair.first].type;
				f = std::min(f, dem[type] / kvpair.second);
			}
			rep -= f;

			tmp.push_back(MP(f, std::vector<int_pair>(all(count))));
			for (const auto &kvpair : count) {
				int type = inst.items[kvpair.first].type;
				dem[type] -= f * kvpair.second;
			}
		}
	}

	std::map<std::vector<int_pair>, int> mp;
	for (pattern_pair &pp : tmp) {
		sort(all(pp.second));
		mp[pp.second] += pp.first;
	}

	std::vector<pattern_pair> finalsol;
	for (const auto &kvpair : mp) {
		finalsol.push_back(MP(kvpair.second, kvpair.first));
	}
	return finalsol;
}